

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons1.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  pthread_t local_28;
  pthread_t tid_consumer;
  pthread_t tid_producer;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  tid_producer = (pthread_t)argv;
  argv_local._0_4_ = argc;
  if (argc != 2) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x18);
    err_quit("usage: %s [number of items]",*(undefined8 *)tid_producer);
  }
  nitems = atoi(*(char **)(tid_producer + 8));
  sem_unlink("/sem_mutex");
  sem_unlink("/sem_nempty");
  sem_unlink("/sem_nstored");
  shared.mutex = (sem_t *)sem_open("/sem_mutex",0xc0,(ulong)_FILE_MODE,1);
  shared.nempty = (sem_t *)sem_open("/sem_nempty",0xc0,(ulong)_FILE_MODE,10);
  shared.nstored = (sem_t *)sem_open("/sem_nstored",0xc0,(ulong)_FILE_MODE,0);
  if (shared.mutex == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x24);
    piVar2 = __errno_location();
    err_quit("Failed to create semaphore mutex: %d",*piVar2);
  }
  if (shared.nempty == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x25);
    piVar2 = __errno_location();
    err_quit("Failed to create semaphore nempty: %d",*piVar2);
  }
  if (shared.nstored == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x26);
    piVar2 = __errno_location();
    err_quit("Failed to create semaphore nstored: %d",*piVar2);
  }
  iVar1 = pthread_create(&tid_consumer,(pthread_attr_t *)0x0,producer,(void *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x29);
    err_quit("Failed to create producer thread");
  }
  iVar1 = pthread_create(&local_28,(pthread_attr_t *)0x0,consumer,(void *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x2b);
    err_quit("Failed to create consumer thread");
  }
  iVar1 = pthread_join(tid_consumer,(void **)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x2e);
    err_quit("Failed to join producer thread: %ld",tid_consumer);
  }
  iVar1 = pthread_join(local_28,(void **)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x30);
    err_quit("Failed to join consumer thread: %ld",local_28);
  }
  iVar1 = sem_unlink("/sem_mutex");
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x32);
    err_quit("Failed to unlink semaphore mutex");
  }
  iVar1 = sem_unlink("/sem_nempty");
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x33);
    err_quit("Failed to unlink semaphore nempty");
  }
  iVar1 = sem_unlink("/sem_nstored");
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
            ,0x34);
    err_quit("Failed to unlink semaphore nstored");
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  pthread_t tid_producer, tid_consumer;

  ASSERT_ERR_QUIT(argc == 2, "usage: %s [number of items]", argv[0]);

  nitems = atoi(argv[1]);

  sem_unlink(SEM_MUTEX);
  sem_unlink(SEM_NEMPTY);  
  sem_unlink(SEM_NSTORED);  

  shared.mutex = sem_open(SEM_MUTEX, O_CREAT | O_EXCL, FILE_MODE, 1);
  shared.nempty = sem_open(SEM_NEMPTY, O_CREAT | O_EXCL, FILE_MODE, NBUFF);
  shared.nstored = sem_open(SEM_NSTORED, O_CREAT | O_EXCL, FILE_MODE, 0);

  ASSERT_ERR_QUIT(shared.mutex != SEM_FAILED, "Failed to create semaphore mutex: %d", errno);
  ASSERT_ERR_QUIT(shared.nempty != SEM_FAILED, "Failed to create semaphore nempty: %d", errno);
  ASSERT_ERR_QUIT(shared.nstored != SEM_FAILED, "Failed to create semaphore nstored: %d", errno);

  ASSERT_ERR_QUIT(pthread_create(&tid_producer, NULL, &producer, NULL) == 0, 
    "Failed to create producer thread");
  ASSERT_ERR_QUIT(pthread_create(&tid_consumer, NULL, &consumer, NULL) == 0,
    "Failed to create consumer thread");

  ASSERT_ERR_QUIT(pthread_join(tid_producer, NULL) == 0, 
    "Failed to join producer thread: %ld", tid_producer);
  ASSERT_ERR_QUIT(pthread_join(tid_consumer, NULL) == 0, 
    "Failed to join consumer thread: %ld", tid_consumer);
  
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_MUTEX), "Failed to unlink semaphore mutex");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NEMPTY), "Failed to unlink semaphore nempty");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NSTORED), "Failed to unlink semaphore nstored");

  return 0;
}